

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_flip.cpp
# Opt level: O0

Bytes __thiscall
Omega_h::prevent_coarsen_flip2_dim<3>
          (Omega_h *this,Mesh *mesh,Bytes *sides_matter,Bytes *verts_matter,Reals *vert_normals,
          LOs *cands2edges,Bytes *cand_codes,Real epsilon)

{
  Int IVar1;
  LO size_in;
  void *extraout_RDX;
  Bytes BVar2;
  Read<int> local_210;
  Write<signed_char> local_200;
  Read<signed_char> local_1f0;
  undefined1 local_1e0 [8];
  type f;
  string local_110 [32];
  undefined1 local_f0 [8];
  Write<signed_char> out;
  undefined1 local_d8 [4];
  LO ncands;
  Reals coords;
  Adj v2s;
  undefined1 local_88 [8];
  LOs sv2v;
  LOs ev2v;
  int side_dim;
  Real epsilon_local;
  LOs *cands2edges_local;
  Reals *vert_normals_local;
  Bytes *verts_matter_local;
  Bytes *sides_matter_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    IVar1 = (Int)mesh;
    Mesh::ask_verts_of((Mesh *)&sv2v.write_.shared_alloc_.direct_ptr,IVar1);
    Mesh::ask_verts_of((Mesh *)local_88,IVar1);
    Mesh::ask_up((Adj *)&coords.write_.shared_alloc_.direct_ptr,mesh,0,2);
    Mesh::coords((Mesh *)local_d8);
    if (((ulong)(cands2edges->write_).shared_alloc_.alloc & 1) == 0) {
      local_10._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((cands2edges->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((ulong)(cands2edges->write_).shared_alloc_.alloc >> 3);
    }
    size_in = (LO)((ulong)local_10._M_pi >> 2);
    out.shared_alloc_.direct_ptr._4_4_ = size_in;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_110,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7));
    Write<signed_char>::Write((Write<signed_char> *)local_f0,size_in,(string *)local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7))
    ;
    Read<int>::Read((Read<int> *)local_1e0,cands2edges);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.cands2edges.write_.shared_alloc_.direct_ptr,cand_codes);
    Read<int>::Read((Read<int> *)&f.cand_codes.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&sv2v.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.ev2v.write_.shared_alloc_.direct_ptr,verts_matter);
    Adj::Adj((Adj *)&f.verts_matter.write_.shared_alloc_.direct_ptr,
             (Adj *)&coords.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.v2s.codes.write_.shared_alloc_.direct_ptr,sides_matter);
    Read<int>::Read((Read<int> *)&f.sides_matter.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)local_88);
    Read<double>::Read((Read<double> *)&f.sv2v.write_.shared_alloc_.direct_ptr,
                       (Read<double> *)local_d8);
    Read<double>::Read((Read<double> *)&f.coords.write_.shared_alloc_.direct_ptr,vert_normals);
    f.vert_normals.write_.shared_alloc_.direct_ptr = (void *)epsilon;
    Write<signed_char>::Write((Write<signed_char> *)&f.epsilon,(Write<signed_char> *)local_f0);
    parallel_for<Omega_h::prevent_coarsen_flip2_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<signed_char>,double)::_lambda(int)_1_>
              (out.shared_alloc_.direct_ptr._4_4_,(type *)local_1e0,"prevent_coarsen_flip");
    Write<signed_char>::Write(&local_200,(Write<signed_char> *)local_f0);
    Read<signed_char>::Read(&local_1f0,&local_200);
    Read<int>::Read(&local_210,cands2edges);
    Mesh::sync_subset_array<signed_char>
              ((Mesh *)this,IVar1,(Read<signed_char> *)0x1,(LOs *)&local_1f0,(char)&local_210,0);
    Read<int>::~Read(&local_210);
    Read<signed_char>::~Read(&local_1f0);
    Write<signed_char>::~Write(&local_200);
    prevent_coarsen_flip2_dim<3>(Omega_h::Mesh*,Omega_h::Read<signed_char>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Read<signed_char>,double)
    ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_1e0);
    Write<signed_char>::~Write((Write<signed_char> *)local_f0);
    Read<double>::~Read((Read<double> *)local_d8);
    Adj::~Adj((Adj *)&coords.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)local_88);
    Read<int>::~Read((Read<int> *)&sv2v.write_.shared_alloc_.direct_ptr);
    BVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->dim() == dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_flip.cpp"
       ,0x4a);
}

Assistant:

Bytes prevent_coarsen_flip2_dim(Mesh* mesh,
    Bytes sides_matter,  // exposed sides adjacent to candidate vertices
    Bytes verts_matter,  // vertices adjacent to sides that matter
    Reals vert_normals, LOs cands2edges, Bytes cand_codes,
    Real epsilon = OMEGA_H_EPSILON) {  // below this value a dot product is
                                       // considered negative
  OMEGA_H_CHECK(mesh->dim() == dim);
  constexpr auto side_dim = dim - 1;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto sv2v = mesh->ask_verts_of(side_dim);
  auto v2s = mesh->ask_up(VERT, side_dim);
  auto coords = mesh->coords();
  auto ncands = cands2edges.size();
  auto out = Write<Byte>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      if (!verts_matter[v_col]) continue;
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      for (auto vs = v2s.a2ab[v_col]; vs < v2s.a2ab[v_col + 1]; ++vs) {
        auto s = v2s.ab2b[vs];
        if (!sides_matter[s]) continue;
        auto vs_code = v2s.codes[vs];
        auto ssv_col = code_which_down(vs_code);
        auto ssv2v = gather_verts<side_dim + 1>(sv2v, s);
        Int ssv;
        for (ssv = 0; ssv < side_dim + 1; ++ssv) {
          if (ssv2v[ssv] == v_onto) break;  // ignore sides that will disappear
        }
        if (ssv != side_dim + 1)
          continue;               // ignore sides that will disappear (part 2)
        ssv2v[ssv_col] = v_onto;  // simulate the edge collapse on this side
        auto ssv2x = gather_vectors<side_dim + 1, dim>(coords, ssv2v);
        auto sn = get_side_vector(ssv2x);  // get its new normal
        // compare the new side normal with the old normals of its vertices
        auto ssv2n = gather_vectors<side_dim + 1, dim>(vert_normals, ssv2v);
        for (ssv = 0; ssv < side_dim + 1; ++ssv) {
          if (ssv2n[ssv] * sn < epsilon) break;
        }
        if (ssv < side_dim + 1) {  // got a violator here
          code = dont_collapse(code, eev_col);
        }
      }
    }
    out[cand] = code;
  };
  parallel_for(ncands, f, "prevent_coarsen_flip");
  return mesh->sync_subset_array(
      EDGE, Bytes(out), cands2edges, I8(DONT_COLLAPSE), 1);
}